

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmHashmapInsert(jx9_hashmap *pMap,char *zKey,int nKeylen,char *zData,int nLen)

{
  char *pcVar1;
  sxi32 sVar2;
  char *pcVar3;
  anon_union_8_3_18420de5_for_x *pObj;
  anon_union_8_3_18420de5_for_x local_a8;
  undefined8 uStack_a0;
  jx9_vm *local_98;
  jx9_vm *pjStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_union_8_3_18420de5_for_x local_68;
  undefined8 uStack_60;
  jx9_vm *local_58;
  jx9_vm *pjStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_98 = pMap->pVm;
  local_68.rVal = 0.0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_60 = 0x20;
  local_a8.rVal = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_a0 = 1;
  pjStack_90 = local_98;
  local_58 = local_98;
  pjStack_50 = local_98;
  if (zKey == (char *)0x0) {
    pObj = (anon_union_8_3_18420de5_for_x *)0x0;
  }
  else {
    if (nKeylen < 0) {
      pcVar3 = zKey;
      if (*zKey != '\0') {
        pcVar1 = zKey + 2;
        do {
          pcVar3 = pcVar1;
          if (pcVar3[-1] == '\0') {
            pcVar3 = pcVar3 + -1;
            goto LAB_00121b77;
          }
          if (*pcVar3 == '\0') goto LAB_00121b77;
          if (pcVar3[1] == '\0') {
            pcVar3 = pcVar3 + 1;
            goto LAB_00121b77;
          }
          pcVar1 = pcVar3 + 4;
        } while (pcVar3[2] != '\0');
        pcVar3 = pcVar3 + 2;
      }
LAB_00121b77:
      nKeylen = (int)pcVar3 - (int)zKey;
    }
    pObj = &local_68;
    jx9MemObjStringAppend((jx9_value *)pObj,zKey,nKeylen);
  }
  if (zData != (char *)0x0) {
    if (nLen < 0) {
      pcVar3 = zData;
      if (*zData != '\0') {
        pcVar1 = zData + 2;
        do {
          pcVar3 = pcVar1;
          if (pcVar3[-1] == '\0') {
            pcVar3 = pcVar3 + -1;
            goto LAB_00121bd0;
          }
          if (*pcVar3 == '\0') goto LAB_00121bd0;
          if (pcVar3[1] == '\0') {
            pcVar3 = pcVar3 + 1;
            goto LAB_00121bd0;
          }
          pcVar1 = pcVar3 + 4;
        } while (pcVar3[2] != '\0');
        pcVar3 = pcVar3 + 2;
      }
LAB_00121bd0:
      nLen = (int)pcVar3 - (int)zData;
    }
    jx9MemObjStringAppend((jx9_value *)&local_a8,zData,nLen);
  }
  sVar2 = HashmapInsert(pMap,(jx9_value *)pObj,(jx9_value *)&local_a8);
  jx9MemObjRelease((jx9_value *)&local_68);
  jx9MemObjRelease((jx9_value *)&local_a8);
  return sVar2;
}

Assistant:

static sxi32 VmHashmapInsert(
	jx9_hashmap *pMap,  /* Target hashmap  */
	const char *zKey,   /* Entry key */
	int nKeylen,        /* zKey length*/
	const char *zData,  /* Entry data */
	int nLen            /* zData length */
	)
{
	jx9_value sKey,sValue;
	jx9_value *pKey;
	sxi32 rc;
	pKey = 0;
	jx9MemObjInit(pMap->pVm, &sKey);
	jx9MemObjInitFromString(pMap->pVm, &sValue, 0);
	if( zKey ){
		if( nKeylen < 0 ){
			nKeylen = (int)SyStrlen(zKey);
		}
		jx9MemObjStringAppend(&sKey, zKey, (sxu32)nKeylen);
		pKey = &sKey;
	}
	if( zData ){
		if( nLen < 0 ){
			/* Compute length automatically */
			nLen = (int)SyStrlen(zData);
		}
		jx9MemObjStringAppend(&sValue, zData, (sxu32)nLen);
	}
	/* Perform the insertion */
	rc = jx9HashmapInsert(&(*pMap),pKey,&sValue);
	jx9MemObjRelease(&sKey);
	jx9MemObjRelease(&sValue);
	return rc;
}